

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

void __thiscall QTextBlock::setUserData(QTextBlock *this,QTextBlockUserData *data)

{
  QTextBlockData *pQVar1;
  QTextBlockUserData *in_RSI;
  QFragmentMap<QTextBlockData> *in_RDI;
  QTextBlockData *b;
  undefined8 in_stack_ffffffffffffffd8;
  
  if (((in_RDI->data).field_0.head != (Header *)0x0) && (*(int *)&in_RDI[1].data.field_0 != 0)) {
    QTextDocumentPrivate::blockMap((QTextDocumentPrivate *)(in_RDI->data).field_0.head);
    pQVar1 = QFragmentMap<QTextBlockData>::fragment
                       (in_RDI,(uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if ((in_RSI != pQVar1->userData) && (pQVar1->userData != (QTextBlockUserData *)0x0)) {
      (*pQVar1->userData->_vptr_QTextBlockUserData[1])();
    }
    pQVar1->userData = in_RSI;
  }
  return;
}

Assistant:

void QTextBlock::setUserData(QTextBlockUserData *data)
{
    if (!p || !n)
        return;

    const QTextBlockData *b = p->blockMap().fragment(n);
    if (data != b->userData)
        delete b->userData;
    b->userData = data;
}